

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_allocator.hpp
# Opt level: O0

void __thiscall libtorrent::aux::stack_allocator::~stack_allocator(stack_allocator *this)

{
  stack_allocator *this_local;
  
  container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::~container_wrapper
            (&this->m_storage);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT stack_allocator
	{
		stack_allocator() {}

		// non-copyable
		stack_allocator(stack_allocator const&) = delete;
		stack_allocator& operator=(stack_allocator const&) = delete;
		stack_allocator(stack_allocator&&) = default;
		stack_allocator& operator=(stack_allocator&&) & = default;

		allocation_slot copy_string(string_view str);
		allocation_slot copy_string(char const* str);

		allocation_slot format_string(char const* fmt, va_list v);

		allocation_slot copy_buffer(span<char const> buf);
		allocation_slot allocate(int bytes);
		char* ptr(allocation_slot idx);
		char const* ptr(allocation_slot idx) const;
		void swap(stack_allocator& rhs);
		void reset();

	private:

		vector<char> m_storage;
	}